

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealBox.cpp
# Opt level: O0

void __thiscall amrex::RealBox::RealBox(RealBox *this,Box *bx,Real *dx,Real *base)

{
  CellIndex CVar1;
  int *piVar2;
  int *piVar3;
  long in_RCX;
  long in_RDX;
  Box *in_RSI;
  long in_RDI;
  int shft;
  int i;
  int *bhi;
  int *blo;
  int local_34;
  
  piVar2 = Box::loVect(in_RSI);
  piVar3 = Box::hiVect(in_RSI);
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    *(double *)(in_RDI + (long)local_34 * 8) =
         *(double *)(in_RDX + (long)local_34 * 8) * (double)piVar2[local_34] +
         *(double *)(in_RCX + (long)local_34 * 8);
    CVar1 = Box::type(in_RSI,local_34);
    *(double *)(in_RDI + 0x18 + (long)local_34 * 8) =
         *(double *)(in_RDX + (long)local_34 * 8) *
         (double)(int)(piVar3[local_34] + (uint)(CVar1 == CELL)) +
         *(double *)(in_RCX + (long)local_34 * 8);
  }
  return;
}

Assistant:

RealBox::RealBox (const Box&  bx,
                  const Real* dx,
                  const Real* base) noexcept
{
    const int* blo = bx.loVect();
    const int* bhi = bx.hiVect();
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = base[i] + dx[i]*blo[i];
        int shft = (bx.type(i) == IndexType::CELL ? 1 : 0);
        xhi[i] = base[i] + dx[i]*(bhi[i]+ shft);
    }
}